

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O3

void handle_conn_shutdown(EVmaster master,EVmaster_msg_ptr msg)

{
  uint uVar1;
  FILE *pFVar2;
  int iVar3;
  int iVar4;
  __pid_t _Var5;
  pthread_t pVar6;
  EVdfg_stone_state p_Var7;
  EVdfg_configuration p_Var8;
  long lVar9;
  EVdfg_stone_state *pp_Var10;
  ulong uVar11;
  EVdfg p_Var12;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  int target_stone;
  timespec ts;
  char *contact_str;
  uint local_64;
  EVdfg local_60;
  timespec local_58;
  char *local_48;
  long local_40;
  char *local_38;
  
  iVar4 = (msg->u).flush_reconfig.reconfig;
  p_Var12 = master->dfg;
  pp_Var10 = p_Var12->deployed_state->stones;
  p_Var7 = *pp_Var10;
  if (p_Var7->stone_id != iVar4) {
    lVar9 = 1;
    do {
      p_Var7 = pp_Var10[lVar9];
      lVar9 = lVar9 + 1;
    } while (p_Var7->stone_id != iVar4);
  }
  p_Var7->condition = EVstone_Frozen;
  master->state = DFG_Reconfiguring;
  local_60 = p_Var12;
  iVar3 = CMtrace_val[0xd];
  if (master->cm->CMTrace_file == (FILE *)0x0) {
    iVar3 = CMtrace_init(master->cm,EVdfgVerbose);
  }
  if (iVar3 != 0) {
    if (CMtrace_PID != 0) {
      pFVar2 = (FILE *)master->cm->CMTrace_file;
      _Var5 = getpid();
      pVar6 = pthread_self();
      p_Var12 = local_60;
      fprintf(pFVar2,"P%lxT%lx - ",(long)_Var5,pVar6);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_58);
      fprintf((FILE *)master->cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,local_58.tv_nsec);
    }
    fprintf((FILE *)master->cm->CMTrace_file,
            "EVDFG conn_shutdown_handler -  master DFG state is now %s\n",str_state[master->state]);
  }
  fflush((FILE *)master->cm->CMTrace_file);
  if (master->node_fail_handler == (EVmasterFailHandlerFunc)0x0) {
    return;
  }
  local_64 = 0xffffffff;
  local_38 = (char *)0x0;
  iVar3 = CMtrace_val[0xd];
  if (master->cm->CMTrace_file == (FILE *)0x0) {
    iVar3 = CMtrace_init(master->cm,EVdfgVerbose);
  }
  if (iVar3 != 0) {
    if (CMtrace_PID != 0) {
      pFVar2 = (FILE *)master->cm->CMTrace_file;
      _Var5 = getpid();
      pVar6 = pthread_self();
      p_Var12 = local_60;
      fprintf(pFVar2,"P%lxT%lx - ",(long)_Var5,pVar6);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_58);
      fprintf((FILE *)master->cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,local_58.tv_nsec);
    }
    fwrite("IN CONN_SHUTDOWN_HANDLER\n",0x19,1,(FILE *)master->cm->CMTrace_file);
  }
  fflush((FILE *)master->cm->CMTrace_file);
  iVar3 = p_Var12->stone_count;
  if (0 < iVar3) {
    p_Var8 = p_Var12->deployed_state;
    uVar13 = 0;
    do {
      pp_Var10 = p_Var8->stones;
      p_Var7 = pp_Var10[uVar13];
      if (0 < p_Var7->out_count) {
        uVar11 = 0;
        do {
          if (p_Var7->out_links[uVar11] == iVar4) {
            if (0 < (long)p_Var8->stone_count) {
              lVar9 = 0;
              do {
                p_Var7 = pp_Var10[lVar9];
                if (p_Var7->stone_id == iVar4) goto LAB_00146fa9;
                lVar9 = lVar9 + 1;
              } while (p_Var8->stone_count != lVar9);
            }
            p_Var7 = (EVdfg_stone_state)0x0;
LAB_00146fa9:
            iVar3 = CMtrace_val[0xd];
            if (master->cm->CMTrace_file == (FILE *)0x0) {
              iVar3 = CMtrace_init(master->cm,EVdfgVerbose);
            }
            if (iVar3 != 0) {
              if (CMtrace_PID != 0) {
                pFVar2 = (FILE *)master->cm->CMTrace_file;
                _Var5 = getpid();
                pVar6 = pthread_self();
                p_Var12 = local_60;
                fprintf(pFVar2,"P%lxT%lx - ",(long)_Var5,pVar6);
              }
              if (CMtrace_timing != 0) {
                clock_gettime(1,&local_58);
                fprintf((FILE *)master->cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,
                        local_58.tv_nsec);
              }
              fprintf((FILE *)master->cm->CMTrace_file,
                      "Found reporting stone as output %d of stone %d\n",uVar11 & 0xffffffff,
                      uVar13 & 0xffffffff);
            }
            fflush((FILE *)master->cm->CMTrace_file);
            parse_bridge_action_spec(p_Var7->action,(int *)&local_64,&local_38);
            iVar3 = CMtrace_val[0xd];
            if (master->cm->CMTrace_file == (FILE *)0x0) {
              iVar3 = CMtrace_init(master->cm,EVdfgVerbose);
            }
            if (iVar3 != 0) {
              if (CMtrace_PID != 0) {
                pFVar2 = (FILE *)master->cm->CMTrace_file;
                _Var5 = getpid();
                pVar6 = pthread_self();
                p_Var12 = local_60;
                fprintf(pFVar2,"P%lxT%lx - ",(long)_Var5,pVar6);
              }
              if (CMtrace_timing != 0) {
                clock_gettime(1,&local_58);
                fprintf((FILE *)master->cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,
                        local_58.tv_nsec);
              }
              fprintf((FILE *)master->cm->CMTrace_file,"Dead stone is %d\n",(ulong)local_64);
            }
            fflush((FILE *)master->cm->CMTrace_file);
            p_Var8 = p_Var12->deployed_state;
          }
          uVar11 = uVar11 + 1;
          pp_Var10 = p_Var8->stones;
          p_Var7 = pp_Var10[uVar13];
        } while ((long)uVar11 < (long)p_Var7->out_count);
        iVar3 = p_Var12->stone_count;
      }
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)iVar3);
    if (0 < iVar3) {
      lVar9 = 0;
      pcVar14 = (char *)0x0;
      do {
        p_Var7 = p_Var12->deployed_state->stones[lVar9];
        if (p_Var7->stone_id == local_64) {
          uVar1 = p_Var7->node;
          iVar4 = CMtrace_val[0xd];
          if (master->cm->CMTrace_file == (FILE *)0x0) {
            iVar4 = CMtrace_init(master->cm,EVdfgVerbose);
          }
          if (iVar4 != 0) {
            if (CMtrace_PID != 0) {
              pFVar2 = (FILE *)master->cm->CMTrace_file;
              _Var5 = getpid();
              pVar6 = pthread_self();
              fprintf(pFVar2,"P%lxT%lx - ",(long)_Var5,pVar6);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,&local_58);
              fprintf((FILE *)master->cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,
                      local_58.tv_nsec);
            }
            fprintf((FILE *)master->cm->CMTrace_file,"Dead node is %d, name %s\n",(ulong)uVar1,
                    master->nodes[(int)uVar1].canonical_name);
          }
          fflush((FILE *)master->cm->CMTrace_file);
          pcVar14 = master->nodes[(int)uVar1].canonical_name;
          master->nodes[(int)uVar1].shutdown_status_contribution = -3;
          iVar3 = local_60->stone_count;
          p_Var12 = local_60;
          if (0 < iVar3) {
            p_Var8 = local_60->deployed_state;
            lVar15 = 0;
            local_48 = pcVar14;
            local_40 = lVar9;
            do {
              if (p_Var8->stones[lVar15]->node == uVar1) {
                iVar4 = CMtrace_val[0xd];
                if (master->cm->CMTrace_file == (FILE *)0x0) {
                  iVar4 = CMtrace_init(master->cm,EVdfgVerbose);
                }
                if (iVar4 != 0) {
                  if (CMtrace_PID != 0) {
                    pFVar2 = (FILE *)master->cm->CMTrace_file;
                    _Var5 = getpid();
                    pVar6 = pthread_self();
                    fprintf(pFVar2,"P%lxT%lx - ",(long)_Var5,pVar6);
                  }
                  if (CMtrace_timing != 0) {
                    clock_gettime(1,&local_58);
                    fprintf((FILE *)master->cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,
                            local_58.tv_nsec);
                  }
                  fprintf((FILE *)master->cm->CMTrace_file,"Dead node is %d, name %s\n",(ulong)uVar1
                          ,master->nodes[(int)uVar1].canonical_name);
                }
                fflush((FILE *)master->cm->CMTrace_file);
                p_Var8 = local_60->deployed_state;
                p_Var8->stones[lVar15]->condition = EVstone_Lost;
                iVar3 = local_60->stone_count;
              }
              lVar15 = lVar15 + 1;
              lVar9 = local_40;
              p_Var12 = local_60;
              pcVar14 = local_48;
            } while (lVar15 < iVar3);
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar3);
      goto LAB_00147444;
    }
  }
  pcVar14 = (char *)0x0;
LAB_00147444:
  IntCManager_unlock(master->cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                     ,0x447);
  (*master->node_fail_handler)(p_Var12,pcVar14,local_64);
  IntCManager_lock(master->cm,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                   ,0x449);
  master->reconfig = 1;
  master->sig_reconfig_bool = 1;
  check_all_nodes_registered(master);
  return;
}

Assistant:

static void 
handle_conn_shutdown(EVmaster master, EVmaster_msg_ptr msg)
{
    int stone = msg->u.conn_shutdown.stone;
    EVdfg_stone_state reporting_stone = find_stone_state(stone, master->dfg->deployed_state);
    EVdfg dfg = master->dfg;

    /* this stone is automatically frozen by EVPath */
    reporting_stone->condition = EVstone_Frozen;
    master->state = DFG_Reconfiguring;
    
    CMtrace_out(master->cm, EVdfgVerbose, "EVDFG conn_shutdown_handler -  master DFG state is now %s\n", str_state[master->state]);
    if (master->node_fail_handler != NULL) {
	int i;
	int target_stone = -1;
	char *failed_node = NULL;
	char *contact_str = NULL;
	CMtrace_out(master->cm, EVdfgVerbose, "IN CONN_SHUTDOWN_HANDLER\n");
	for (i=0; i< dfg->stone_count; i++) {
	    int j;
	    for (j = 0; j < dfg->deployed_state->stones[i]->out_count; j++) {
		if (dfg->deployed_state->stones[i]->out_links[j] == stone) {
		    int out_stone_id = dfg->deployed_state->stones[i]->out_links[j];
		    EVdfg_stone_state out_stone = find_stone_state(out_stone_id, dfg->deployed_state);
		    CMtrace_out(master->cm, EVdfgVerbose, "Found reporting stone as output %d of stone %d\n",
				j, i);
		    parse_bridge_action_spec(out_stone->action, 
					     &target_stone, &contact_str);
		    CMtrace_out(master->cm, EVdfgVerbose, "Dead stone is %d\n", target_stone);
		}
	    }
	}
	for (i=0; i< dfg->stone_count; i++) {
	    if (dfg->deployed_state->stones[i]->stone_id == target_stone) {
		int node = dfg->deployed_state->stones[i]->node;
		int j;
		CMtrace_out(master->cm, EVdfgVerbose, "Dead node is %d, name %s\n", node,
			    master->nodes[node].canonical_name);
		failed_node = master->nodes[node].canonical_name;
		master->nodes[node].shutdown_status_contribution = STATUS_FAILED;
		for (j=0; j< dfg->stone_count; j++) {
		    if (dfg->deployed_state->stones[j]->node == node) {;
			CMtrace_out(master->cm, EVdfgVerbose, "Dead node is %d, name %s\n", node,
				    master->nodes[node].canonical_name);
			dfg->deployed_state->stones[j]->condition = EVstone_Lost;
		    }
		}
	    }
	}
	CManager_unlock(master->cm);
	master->node_fail_handler(dfg, failed_node, target_stone);
	CManager_lock(master->cm);
	master->reconfig = 1;
	master->sig_reconfig_bool = 1;
	check_all_nodes_registered(master);
    }
}